

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

DataBuffer * __thiscall TCPConnection::GetTxBuffer(TCPConnection *this)

{
  DataBuffer *pDVar1;
  
  pDVar1 = ProtocolIPv4::GetTxBuffer(this->IP,this->MAC);
  if (pDVar1 != (DataBuffer *)0x0) {
    pDVar1->Packet = pDVar1->Packet + 0x14;
    pDVar1->Remainder = pDVar1->Remainder - 0x14;
  }
  return pDVar1;
}

Assistant:

DataBuffer* TCPConnection::GetTxBuffer()
{
    DataBuffer* rc;

    rc = IP->GetTxBuffer(MAC);
    if (rc)
    {
        rc->Packet += ProtocolTCP::header_size();
        rc->Remainder -= ProtocolTCP::header_size();
    }

    return rc;
}